

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageTimeOperator::process
          (MessageTimeOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  pointer pMVar3;
  TimeRepresentation<count_time<9,_long>_> in_RDX;
  long in_RSI;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffffa8;
  function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  *in_stack_ffffffffffffffb0;
  
  bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffffb0);
  if (bVar1) {
    in_stack_ffffffffffffffb0 =
         (function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
          *)(in_RSI + 8);
    CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x44be16);
    TVar2 = std::
            function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
            ::operator()(in_stack_ffffffffffffffb0,in_RDX);
    pMVar3 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
             operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        0x44be3c);
    (pMVar3->time).internalTimeCode = TVar2.internalTimeCode;
  }
  CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageTimeOperator::process(std::unique_ptr<Message> message)
{
    if (TimeFunction) {
        message->time = TimeFunction(message->time);
    }
    return message;
}